

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestValidate.c
# Opt level: O3

void RDL_validate(RDL_data *data,RDL_DimacsGraph *dimacs_graph,int timeout,int *urf_result,
                 int *basis_result)

{
  int *piVar1;
  size_t __size;
  char **ppcVar2;
  undefined4 *puVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  void *pvVar8;
  void *__ptr;
  void *pvVar9;
  ulong uVar10;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  RDL_data *pRVar14;
  int iVar15;
  RDL_cycle **cycle_array;
  char **other_cycle_array;
  char **basis_cycle_array;
  long local_90;
  void *local_88;
  void *local_80;
  int *local_78;
  RDL_data *local_70;
  int local_64;
  ulong local_60;
  ulong local_58;
  RDL_DimacsGraph *local_50;
  int *local_48;
  void *local_40;
  undefined8 local_38;
  
  iVar15 = 0;
  *urf_result = 0;
  *basis_result = 0;
  local_78 = urf_result;
  local_64 = timeout;
  local_50 = dimacs_graph;
  local_48 = basis_result;
  uVar4 = RDL_getRCycles(data,&local_90);
  uVar10 = (ulong)uVar4;
  RDL_deleteCycles(local_90,uVar4);
  local_88 = (void *)(uVar10 * 8);
  pvVar8 = malloc((size_t)local_88);
  local_58 = uVar10;
  __ptr = malloc(uVar10 * 4);
  iVar5 = RDL_getNofURF(data);
  local_70 = data;
  local_60 = RDL_getNofEdges(data);
  pRVar14 = local_70;
  local_80 = (void *)CONCAT44(local_80._4_4_,iVar5);
  if (iVar5 != 0) {
    iVar5 = 0;
    do {
      uVar6 = RDL_getRCyclesForURF(pRVar14,iVar15,&local_90);
      uVar4 = RDL_translateCycArray(pRVar14,local_90,uVar6,&local_40);
      RDL_deleteCycles(local_90,uVar4);
      if (uVar4 != 0) {
        uVar10 = 0;
        do {
          uVar12 = (ulong)(uint)(iVar5 + (int)uVar10);
          *(undefined8 *)((long)pvVar8 + uVar12 * 8) = *(undefined8 *)((long)local_40 + uVar10 * 8);
          *(int *)((long)__ptr + uVar12 * 4) = iVar15;
          uVar10 = uVar10 + 1;
        } while (uVar4 != uVar10);
        iVar5 = iVar5 + (int)uVar10;
      }
      free(local_40);
      iVar15 = iVar15 + 1;
    } while (iVar15 != (int)local_80);
  }
  local_80 = malloc((size_t)local_88);
  uVar10 = local_58;
  uVar12 = local_60 & 0xffffffff;
  if (local_58 != 0) {
    local_88 = (void *)(ulong)((int)local_60 + 1);
    uVar13 = 0;
    do {
      pvVar9 = malloc((size_t)local_88);
      *(void **)((long)local_80 + uVar13 * 8) = pvVar9;
      memcpy(pvVar9,*(void **)((long)pvVar8 + uVar13 * 8),uVar12);
      *(undefined1 *)((long)pvVar9 + uVar12) = 2;
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
  }
  qsort(local_80,uVar10,8,RDL_cmp_cycles);
  if (local_50->nof_cycles == 0xffffffff) {
    RDL_validate_cold_2();
LAB_00102e2f:
    pRVar14 = local_70;
    piVar11 = local_78;
    if (*local_78 != 0) goto LAB_00102ea0;
    RDL_timeout_stop_fun(&local_64);
    iVar5 = RDL_validateRingFamilies(pvVar8,__ptr,uVar10 & 0xffffffff,local_60,RDL_timeout_stop_fun)
    ;
  }
  else {
    if ((uint)uVar10 == local_50->nof_cycles) {
      if ((uint)uVar10 != 0) {
        ppcVar2 = local_50->sorted_cycles;
        uVar13 = 0;
        do {
          iVar5 = bcmp(*(void **)((long)local_80 + uVar13 * 8),ppcVar2[uVar13],uVar12);
          if (iVar5 != 0) {
            RDL_validate_cold_1();
            goto LAB_00102e8f;
          }
          uVar13 = uVar13 + 1;
        } while (uVar10 != uVar13);
      }
      goto LAB_00102e2f;
    }
    fprintf(_stderr,"different number of relevant cycles %u vs %u!\n",uVar10 & 0xffffffff);
LAB_00102e8f:
    iVar5 = 1;
    piVar11 = local_78;
    pRVar14 = local_70;
  }
  *piVar11 = iVar5;
LAB_00102ea0:
  uVar4 = RDL_getSSSR(pRVar14);
  uVar10 = (ulong)uVar4;
  local_78 = (int *)malloc(uVar10 * 4);
  uVar12 = (ulong)pRVar14->bccGraphs->nof_bcc;
  __size = uVar12 * 4;
  pvVar9 = malloc(__size);
  if (uVar12 != 0) {
    memset(pvVar9,0,__size);
  }
  pRVar14 = local_70;
  piVar11 = local_78;
  local_88 = pvVar9;
  if (uVar10 != 0) {
    uVar12 = 0;
    do {
      puVar3 = (undefined4 *)**(undefined8 **)(local_90 + uVar12 * 8);
      uVar7 = RDL_getEdgeId(pRVar14,*puVar3,puVar3[1]);
      uVar7 = *pRVar14->bccGraphs->edge_to_bcc_mapping[uVar7];
      piVar1 = (int *)((long)local_88 + (ulong)uVar7 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)((long)piVar11 + uVar12 * 4) = uVar7;
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
  }
  RDL_translateCycArray(pRVar14,local_90,uVar10,&local_38);
  RDL_deleteCycles(local_90,uVar10);
  RDL_timeout_stop_fun(&local_64);
  uVar12 = local_58;
  iVar5 = RDL_validateBasis(pvVar8,local_58 & 0xffffffff,local_38,uVar4,local_60,piVar11,
                            RDL_timeout_stop_fun);
  *local_48 = iVar5;
  free(piVar11);
  free(__ptr);
  free(local_88);
  RDL_deleteEdgeIdxArray(pvVar8,uVar12 & 0xffffffff);
  RDL_deleteEdgeIdxArray(local_38,uVar10);
  RDL_deleteEdgeIdxArray(local_80,uVar12 & 0xffffffff);
  return;
}

Assistant:

void RDL_validate(RDL_data* data, RDL_DimacsGraph* dimacs_graph, int timeout,
                  int* urf_result, int* basis_result)
{
  unsigned URFcount, idx, weight, nof_relevant, curr_bcc,
    running_idx, idx2, nof_edges, nof_basis, edge, max_nof_basis_bcc=0;
  RDL_cycle **cycle_array;
  char **other_cycle_array, **final_cycle_array, **sortable_cycle_array, **basis_cycle_array;
  unsigned *urf_numbers, *bcc, *nof_basis_bcc;

  *urf_result = 0;
  *basis_result = 0;

  nof_relevant = RDL_getRCycles(data, &cycle_array);
  RDL_deleteCycles(cycle_array, nof_relevant);

  final_cycle_array = malloc(nof_relevant * sizeof(*final_cycle_array));
  urf_numbers = malloc(nof_relevant * sizeof(*urf_numbers));

  URFcount = RDL_getNofURF(data);

  nof_edges = RDL_getNofEdges(data);

  for (idx = 0, running_idx = 0; idx < URFcount; ++idx) {
    weight = RDL_getRCyclesForURF(data, idx,  &cycle_array);
    weight = RDL_translateCycArray(data, cycle_array, weight, &other_cycle_array);
    RDL_deleteCycles(cycle_array, weight);

    for (idx2 = 0; idx2 < weight; ++idx2, ++running_idx) {
      final_cycle_array[running_idx] = other_cycle_array[idx2];
      urf_numbers[running_idx] = idx;

    }

    free(other_cycle_array);
  }


  sortable_cycle_array = malloc(nof_relevant * sizeof(*sortable_cycle_array));
  for (idx = 0; idx < nof_relevant; ++idx) {
    sortable_cycle_array[idx] = malloc((nof_edges + 1) * sizeof(**sortable_cycle_array));
    memcpy(sortable_cycle_array[idx], final_cycle_array[idx], nof_edges * sizeof(**sortable_cycle_array));
    sortable_cycle_array[idx][nof_edges] = 2;
  }

  qsort(sortable_cycle_array, nof_relevant, sizeof(*sortable_cycle_array), RDL_cmp_cycles);

  if (dimacs_graph->nof_cycles == UINT_MAX) {
    fprintf(stderr, "skipping RC test, no RCs in input file...\n");
  }
  else if (nof_relevant != dimacs_graph->nof_cycles) {
    fprintf(stderr, "different number of relevant cycles %u vs %u!\n",
        nof_relevant, dimacs_graph->nof_cycles);
    *urf_result = 1;
  }
  else {
    for (idx = 0; idx < nof_relevant; ++idx) {
      if (memcmp(sortable_cycle_array[idx], dimacs_graph->sorted_cycles[idx],
          nof_edges * sizeof(**sortable_cycle_array))) {
        fprintf(stderr, "relevant cycle mismatch found!\n");
        *urf_result = 1;
        break;
      }
    }
  }

  if (!*urf_result) {
    RDL_timeout_stop_fun(&timeout);

    *urf_result = RDL_validateRingFamilies((const char**)final_cycle_array, urf_numbers,
        nof_relevant, nof_edges, RDL_timeout_stop_fun);
  }

  nof_basis = RDL_getSSSR(data, &cycle_array);

  bcc = malloc(nof_basis * sizeof(*bcc));
  nof_basis_bcc = malloc(data->bccGraphs->nof_bcc * sizeof(*nof_basis_bcc));
  for (idx = 0; idx < data->bccGraphs->nof_bcc; ++idx) {
    nof_basis_bcc[idx] = 0;
  }
  for (idx = 0; idx < nof_basis; ++idx) {
    edge = RDL_getEdgeId(data, cycle_array[idx]->edges[0][0],
        cycle_array[idx]->edges[0][1]);
    curr_bcc = data->bccGraphs->edge_to_bcc_mapping[edge][0];
    bcc[idx] = curr_bcc;
    ++nof_basis_bcc[curr_bcc];
    max_nof_basis_bcc = nof_basis_bcc[curr_bcc] > max_nof_basis_bcc ? nof_basis_bcc[curr_bcc] : max_nof_basis_bcc;
  }

  RDL_translateCycArray(data, cycle_array, nof_basis, &basis_cycle_array);
  RDL_deleteCycles(cycle_array, nof_basis);

  RDL_timeout_stop_fun(&timeout);
  *basis_result = RDL_validateBasis(
      (const char**)final_cycle_array, nof_relevant,
      (const char**)basis_cycle_array, nof_basis,
      nof_edges, bcc, RDL_timeout_stop_fun);
  free(bcc);
  free(urf_numbers);
  free(nof_basis_bcc);

  RDL_deleteEdgeIdxArray(final_cycle_array, nof_relevant);
  RDL_deleteEdgeIdxArray(basis_cycle_array, nof_basis);
  RDL_deleteEdgeIdxArray(sortable_cycle_array, nof_relevant);
}